

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntConv.H
# Opt level: O1

void amrex::readIntData<unsigned_int,unsigned_int>
               (uint *data,size_t size,istream *is,IntDescriptor *id)

{
  Ordering OVar1;
  Ordering OVar2;
  uint32_t uVar3;
  undefined8 in_RAX;
  IntDescriptor *this;
  size_t sVar4;
  uint value;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  OVar1 = IntDescriptor::order(id);
  this = FPC::NativeIntDescriptor();
  OVar2 = IntDescriptor::order(this);
  if (size != 0) {
    sVar4 = 0;
    do {
      std::istream::read((char *)is,(long)&uStack_38 + 4);
      if (OVar1 != OVar2) {
        uVar3 = swapBytes(uStack_38._4_4_);
        uStack_38 = CONCAT44(uVar3,(undefined4)uStack_38);
      }
      data[sVar4] = uStack_38._4_4_;
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void readIntData (To* data, std::size_t size, std::istream& is,
                      const amrex::IntDescriptor& id)
    {
        From value;
        bool swapEndian = (id.order() != amrex::FPC::NativeIntDescriptor().order());
        for (std::size_t j = 0; j < size; ++j) {
            is.read((char*) &value, sizeof(From));
            if (swapEndian) value = swapBytes(value);
            data[j] = static_cast<To>(value);
        }
    }